

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

void pcut_failed_assertion(char *message)

{
  char *message_local;
  
  if (print_test_error != 0) {
    pcut_print_fail_message(message);
  }
  if (execute_teardown_on_failure == 0) {
    if (report_test_result != 0) {
      pcut_report_test_done(current_test,1,pcut_failed_assertion::prev_message,message,(char *)0x0);
    }
  }
  else {
    execute_teardown_on_failure = 0;
    pcut_failed_assertion::prev_message = message;
    run_setup_teardown(current_suite->teardown_func);
    if (report_test_result != 0) {
      pcut_report_test_done(current_test,1,message,(char *)0x0,(char *)0x0);
    }
  }
  pcut_failed_assertion::prev_message = (char *)0x0;
  leave_test(1);
  return;
}

Assistant:

void pcut_failed_assertion(const char *message) {
	static const char *prev_message = NULL;
	/*
	 * The assertion failed. We need to abort the current test,
	 * inform the user and perform some clean-up. That could
	 * include running the tear-down routine.
	 */
	if (print_test_error) {
		pcut_print_fail_message(message);
	}

	if (execute_teardown_on_failure) {
		execute_teardown_on_failure = 0;
		prev_message = message;
		run_setup_teardown(current_suite->teardown_func);

		/* Tear-down was okay. */
		if (report_test_result) {
			pcut_report_test_done(current_test, PCUT_OUTCOME_FAIL,
				message, NULL, NULL);
		}
	} else {
		if (report_test_result) {
			pcut_report_test_done(current_test, PCUT_OUTCOME_FAIL,
				prev_message, message, NULL);
		}
	}

	prev_message = NULL;

	leave_test(PCUT_OUTCOME_FAIL); /* No return. */
}